

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Designator_PDU::Designator_PDU
          (Designator_PDU *this,EntityIdentifier *DesignatingEntityID,DesignatorCodeName CodeName,
          EntityIdentifier *DesignatedEntityID,DesignatorCode Code,KFLOAT32 Power,
          KFLOAT32 WaveLength,Vector *SpotLocationRegardsToEntity,WorldCoordinates *SpotLocation,
          DeadReckoningAlgorithm DRA,Vector *EntityLinearAcceleration)

{
  Vector *SpotLocationRegardsToEntity_local;
  KFLOAT32 WaveLength_local;
  KFLOAT32 Power_local;
  DesignatorCode Code_local;
  EntityIdentifier *DesignatedEntityID_local;
  DesignatorCodeName CodeName_local;
  EntityIdentifier *DesignatingEntityID_local;
  Designator_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Designator_PDU_0032e4a8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_DesignatingEntityID,DesignatingEntityID);
  this->m_ui16CodeName = (KUINT16)CodeName;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_DesignatedEntityID,DesignatedEntityID);
  this->m_ui16Code = (KUINT16)Code;
  this->m_f32Power = Power;
  this->m_f32WaveLength = WaveLength;
  DATA_TYPE::Vector::Vector(&this->m_SpotRegardsToEntity,SpotLocationRegardsToEntity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_SpotLocation,SpotLocation);
  this->m_ui8DeadReckoningAlgorithm = (KUINT8)DRA;
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  DATA_TYPE::Vector::Vector(&this->m_EntityLinearAcceleration,EntityLinearAcceleration);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui8PDUType = '\x18';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x58;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Designator_PDU::Designator_PDU( const EntityIdentifier & DesignatingEntityID, DesignatorCodeName CodeName,
                                const EntityIdentifier & DesignatedEntityID, DesignatorCode Code, KFLOAT32 Power,
                                KFLOAT32 WaveLength, const Vector & SpotLocationRegardsToEntity,
                                const WorldCoordinates & SpotLocation, DeadReckoningAlgorithm DRA,
                                const Vector & EntityLinearAcceleration ) :
    m_DesignatingEntityID( DesignatingEntityID ),
    m_ui16CodeName( CodeName ),
    m_DesignatedEntityID( DesignatedEntityID ),
    m_ui16Code( Code ),
    m_f32Power( Power ),
    m_f32WaveLength( WaveLength ),
    m_SpotRegardsToEntity( SpotLocationRegardsToEntity ),
    m_SpotLocation( SpotLocation ),
    m_ui8DeadReckoningAlgorithm( DRA ),
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 ),
    m_EntityLinearAcceleration( EntityLinearAcceleration )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = Designator_PDU_Type;
    m_ui16PDULength = DESIGNATOR_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}